

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

bool phmap::priv::operator<
               (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                *x,btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                   *y)

{
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  __last2;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  __last1;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  __first2;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  __first1;
  undefined4 uStack_7c;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
  *y_local;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
  *x_local;
  
  cVar2 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
          ::begin(x);
  cVar3 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
          ::end(x);
  cVar4 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
          ::begin(y);
  cVar5 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
          ::end(y);
  __last2._12_4_ = uStack_7c;
  __last2.position = cVar5.position;
  __last2.node = cVar5.node;
  __last1._12_4_ = 0;
  __last1.node = (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                  *)SUB128(cVar3._0_12_,0);
  __last1.position = SUB124(cVar3._0_12_,8);
  __first2._12_4_ = 0;
  __first2.node =
       (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
        *)SUB128(cVar4._0_12_,0);
  __first2.position = SUB124(cVar4._0_12_,8);
  __first1._12_4_ = 0;
  __first1.node =
       (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
        *)SUB128(cVar2._0_12_,0);
  __first1.position = SUB124(cVar2._0_12_,8);
  bVar1 = std::
          lexicographical_compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>>
                    (__first1,__last1,__first2,__last2);
  return bVar1;
}

Assistant:

bool operator<(const btree_container &x, const btree_container &y) {
            return std::lexicographical_compare(x.begin(), x.end(), y.begin(), y.end());
        }